

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

void __thiscall OjaNewton::update_eigenvalues(OjaNewton *this)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (0 < this->m) {
    lVar2 = 0;
    do {
      iVar1 = this->t;
      fVar5 = (float)iVar1;
      fVar3 = this->learning_rate_cnt / fVar5;
      if (1.0 <= fVar3) {
        fVar3 = 1.0;
      }
      fVar4 = (this->data).AZx[lVar2 + 1] * (this->data).sketch_cnt;
      if (iVar1 == 1) {
        this->ev[lVar2 + 1] = fVar3 * fVar4 * fVar4;
      }
      else {
        this->ev[lVar2 + 1] =
             fVar3 * fVar5 * fVar4 * fVar4 +
             ((1.0 - fVar3) * fVar5 * this->ev[lVar2 + 1]) / (float)(iVar1 + -1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->m);
  }
  return;
}

Assistant:

void update_eigenvalues()
  {
    for (int i = 1; i <= m; i++)
    {
      float gamma = fmin(learning_rate_cnt / t, 1.f);
      float tmp = data.AZx[i] * data.sketch_cnt;

      if (t == 1)
      {
        ev[i] = gamma * tmp * tmp;
      }
      else
      {
        ev[i] = (1 - gamma) * t * ev[i] / (t - 1) + gamma * t * tmp * tmp;
      }
    }
  }